

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_0::BloomFilterPolicy::CreateFilter
          (BloomFilterPolicy *this,Slice *keys,int n,string *dst)

{
  byte *pbVar1;
  size_type sVar2;
  pointer pcVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar8 = this->bits_per_key_ * (long)n;
  uVar10 = 0x40;
  if (0x40 < uVar8) {
    uVar10 = uVar8;
  }
  sVar2 = dst->_M_string_length;
  std::__cxx11::string::resize((ulong)dst,(char)(uVar10 + 7 >> 3) + (char)sVar2);
  std::__cxx11::string::push_back((char)dst);
  if (0 < n) {
    pcVar3 = (dst->_M_dataplus)._M_p;
    uVar8 = 0;
    do {
      uVar7 = Hash(keys[uVar8].data_,keys[uVar8].size_,0xbc9f1d34);
      if (this->k_ != 0) {
        uVar5 = uVar7 << 0xf;
        uVar6 = uVar7 >> 0x11;
        uVar9 = 0;
        do {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar10 + 7 & 0xfffffffffffffff8;
          pbVar1 = (byte *)(pcVar3 + (SUB164(ZEXT416(uVar7) % auVar4,0) >> 3) + sVar2);
          *pbVar1 = *pbVar1 | '\x01' << (SUB161(ZEXT416(uVar7) % auVar4,0) & 7);
          uVar7 = uVar7 + (uVar5 | uVar6);
          uVar9 = uVar9 + 1;
        } while (uVar9 < this->k_);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)n);
  }
  return;
}

Assistant:

void CreateFilter(const Slice* keys, int n, std::string* dst) const override {
    // Compute bloom filter size (in both bits and bytes)
    size_t bits = n * bits_per_key_;

    // For small n, we can see a very high false positive rate.  Fix it
    // by enforcing a minimum bloom filter length.
    if (bits < 64) bits = 64;

    size_t bytes = (bits + 7) / 8;
    bits = bytes * 8;

    const size_t init_size = dst->size();
    dst->resize(init_size + bytes, 0);
    dst->push_back(static_cast<char>(k_));  // Remember # of probes in filter
    char* array = &(*dst)[init_size];
    for (int i = 0; i < n; i++) {
      // Use double-hashing to generate a sequence of hash values.
      // See analysis in [Kirsch,Mitzenmacher 2006].
      uint32_t h = BloomHash(keys[i]);
      const uint32_t delta = (h >> 17) | (h << 15);  // Rotate right 17 bits
      for (size_t j = 0; j < k_; j++) {
        const uint32_t bitpos = h % bits;
        array[bitpos / 8] |= (1 << (bitpos % 8));
        h += delta;
      }
    }
  }